

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DOMRangeImpl::isLegalContainedNode(DOMRangeImpl *this,DOMNode *node)

{
  byte bVar1;
  uint uVar2;
  
  if (node == (DOMNode *)0x0) {
    bVar1 = 0;
  }
  else {
    uVar2 = (*node->_vptr_DOMNode[4])(node);
    bVar1 = 1;
    if (uVar2 < 0xd) {
      bVar1 = (byte)(0x5bb >> ((byte)uVar2 & 0x1f));
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool DOMRangeImpl::isLegalContainedNode(const DOMNode* node ) const {
   if ( node==0 )
       return false;
   switch( node->getNodeType() )
   {
       case DOMNode::DOCUMENT_NODE:
       case DOMNode::DOCUMENT_FRAGMENT_NODE:
       case DOMNode::ATTRIBUTE_NODE:
       case DOMNode::ENTITY_NODE:
       case DOMNode::NOTATION_NODE:
            return false;
       default:
            return true;
   }   
}